

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

ZlibContext * __thiscall
kj::Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext>::
emplace<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Mode,kj::CompressionParameters&>
          (Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext> *this,Mode *params,
          CompressionParameters *params_1)

{
  undefined1 *puVar1;
  Mode MVar2;
  int iVar3;
  ZlibContext *pZVar4;
  int iVar5;
  Fault f;
  int result;
  DebugComparison<int_&,_int> _kjCondition;
  
  if ((this->ptr).isSet == true) {
    (this->ptr).isSet = false;
    MVar2 = (this->ptr).field_1.value.mode;
    if (MVar2 == DECOMPRESS) {
      inflateEnd((undefined1 *)((long)&(this->ptr).field_1 + 8));
    }
    else if (MVar2 == COMPRESS) {
      deflateEnd((undefined1 *)((long)&(this->ptr).field_1 + 8));
    }
  }
  MVar2 = *params;
  pZVar4 = (ZlibContext *)(ulong)MVar2;
  (this->ptr).field_1.value.mode = MVar2;
  puVar1 = (undefined1 *)((long)&(this->ptr).field_1 + 8);
  (this->ptr).field_1.value.ctx.next_in = (Bytef *)0x0;
  *(undefined4 *)((long)&(this->ptr).field_1 + 0x10) = 0;
  (this->ptr).field_1.value.ctx.total_in = 0;
  (this->ptr).field_1.value.ctx.next_out = (Bytef *)0x0;
  *(undefined4 *)((long)&(this->ptr).field_1 + 0x28) = 0;
  (this->ptr).field_1.value.ctx.total_out = 0;
  (this->ptr).field_1.value.ctx.msg = (char *)0x0;
  (this->ptr).field_1.value.ctx.state = (internal_state *)0x0;
  (this->ptr).field_1.value.ctx.zalloc = (alloc_func)0x0;
  (this->ptr).field_1.value.ctx.zfree = (free_func)0x0;
  (this->ptr).field_1.value.ctx.opaque = (voidpf)0x0;
  *(undefined4 *)((long)&(this->ptr).field_1 + 0x60) = 0;
  (this->ptr).field_1.value.ctx.adler = 0;
  (this->ptr).field_1.value.ctx.reserved = 0;
  if (MVar2 == DECOMPRESS) {
    iVar3 = 0xf;
    if ((params_1->inboundMaxWindowBits).ptr.isSet != false) {
      iVar3 = *(int *)&(params_1->inboundMaxWindowBits).ptr.field_1;
    }
    pZVar4 = (ZlibContext *)inflateInit2_(puVar1,-iVar3,"1.2.11",0x70);
    _kjCondition.left = &result;
    result = (int)pZVar4;
    _kjCondition.right = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = result == 0;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[54]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xcbd,FAILED,"result == Z_OK",
                 "_kjCondition,\"Failed to initialize decompression context (inflate).\"",
                 &_kjCondition,
                 (char (*) [54])"Failed to initialize decompression context (inflate).");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else if (MVar2 == COMPRESS) {
    iVar3 = 0xf;
    if ((params_1->outboundMaxWindowBits).ptr.isSet != false) {
      iVar3 = *(int *)&(params_1->outboundMaxWindowBits).ptr.field_1;
    }
    iVar5 = -9;
    if (iVar3 != 8) {
      iVar5 = -iVar3;
    }
    pZVar4 = (ZlibContext *)deflateInit2_(puVar1,0xffffffff,8,iVar5,8,0,"1.2.11",0x70);
    _kjCondition.left = &result;
    result = (int)pZVar4;
    _kjCondition.right = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = result == 0;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[52]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xcb6,FAILED,"result == Z_OK",
                 "_kjCondition,\"Failed to initialize compression context (deflate).\"",
                 &_kjCondition,(char (*) [52])"Failed to initialize compression context (deflate).")
      ;
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  (this->ptr).isSet = true;
  return pZVar4;
}

Assistant:

inline T& emplace(Params&&... params) {
    // Replace this Maybe's content with a new value constructed by passing the given parameters to
    // T's constructor. This can be used to initialize a Maybe without copying or even moving a T.
    // Returns a reference to the newly-constructed value.

    return ptr.emplace(kj::fwd<Params>(params)...);
  }